

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
::rebalance_or_split
          (btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
           *this,iterator *iter)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  short sVar6;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar7;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar8;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar9;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
  *pbVar10;
  slot_type *psVar11;
  slot_type *psVar12;
  slot_type *psVar13;
  template_ElementType<1UL> *ptVar14;
  allocator_type *in_RCX;
  slot_type *psVar15;
  allocator_type *paVar16;
  pair<int,_int> **args;
  ushort uVar17;
  uint uVar18;
  pair<int,_int> **n;
  size_type sVar19;
  allocator_type *in_R9;
  int iVar20;
  uint uVar21;
  size_type sVar22;
  long lVar23;
  int iVar24;
  iterator parent_iter;
  
  fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::count(iter->node);
  fVar2 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != fVar2) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                 );
  }
  fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != '\x1e') {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                 );
  }
  pbVar7 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
           ::parent(iter->node);
  if (iter->node ==
      (this->root_).
      super__Tuple_impl<0UL,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*,_false>
      ._M_head_impl) {
    pbVar7 = new_internal_node(this,pbVar7);
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
    ::init_child(pbVar7,0,(this->root_).
                          super__Tuple_impl<0UL,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*,_false>
                          ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*,_false>
    ._M_head_impl = pbVar7;
    pbVar8 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
             ::child(pbVar7,0);
    bVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::leaf(pbVar8);
    if ((bVar5) &&
       (pbVar8 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                 ::child(pbVar7,0), pbVar8 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                   );
    }
  }
  else {
    fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::position(iter->node);
    if (fVar1 != '\0') {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::position(iter->node);
      pbVar8 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
               ::child(pbVar7,(ulong)bVar3 - 1);
      fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::max_count(pbVar8);
      if (fVar1 != '\x1e') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb5c,
                      "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar8);
      if (bVar3 < 0x1e) {
        bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::count(pbVar8);
        uVar18 = iter->position;
        in_RCX = (allocator_type *)(ulong)uVar18;
        uVar21 = (int)(short)(0x1e - (ushort)bVar3) / (int)(short)(((int)uVar18 < 0x1e) + 1);
        sVar19 = 1;
        if (1 < (short)uVar21) {
          sVar19 = (size_type)(uVar21 & 0xffff);
        }
        iVar24 = (int)sVar19;
        if ((iVar24 <= (int)uVar18) ||
           (bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8), (uint)bVar3 + iVar24 < 0x1e)) {
          pbVar7 = iter->node;
          pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                   ::parent(pbVar8);
          pbVar10 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::parent(pbVar7);
          if (pbVar9 != pbVar10) {
            __assert_fail("parent() == right->parent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x87f,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::position(pbVar8);
          bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::position(pbVar7);
          if (bVar3 + 1 != (uint)bVar4) {
            __assert_fail("position() + 1 == right->position()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x880,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar7);
          bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar8);
          if (bVar3 < bVar4) {
            __assert_fail("right->count() >= count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x881,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar7);
          if ((ushort)sVar19 <= (ushort)bVar3) {
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8);
            pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                     ::parent(pbVar8);
            bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::position(pbVar8);
            parent_iter.node =
                 (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  *)btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::slot(pbVar9,(ulong)bVar4);
            btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
            ::value_init<std::pair<int,int>*>
                      ((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                        *)pbVar8,(ulong)bVar3,(allocator_type *)&parent_iter,
                       (pair<int,_int> **)in_RCX);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8);
            btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::uninitialized_move_n(pbVar7,(ulong)(iVar24 - 1),0,(ulong)bVar3 + 1,pbVar8,in_R9);
            psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,(ulong)(iVar24 - 1));
            pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                     ::parent(pbVar8);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::position(pbVar8);
            psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar9,(ulong)bVar3);
            psVar12->first = psVar11->first;
            psVar15 = (slot_type *)(ulong)(uint)psVar11->second;
            psVar12->second = psVar11->second;
            psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,sVar19);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,(ulong)bVar3);
            psVar13 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,0);
            set_slot_policy<std::pair<int,int>>::
            move<phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>
                      ((PropagatingCountingAlloc<std::pair<int,_int>_> *)psVar11,psVar12,psVar13,
                       psVar15);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::value_destroy_n(pbVar7,(long)(int)((uint)bVar3 - iVar24),sVar19,
                              (allocator_type *)psVar15);
            bVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::leaf(pbVar8);
            if (!bVar5) {
              for (sVar22 = 0; sVar19 != sVar22; sVar22 = sVar22 + 1) {
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar8);
                pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                         ::child(pbVar7,sVar22);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::init_child(pbVar8,(uint)bVar3 + (int)sVar22 + 1,pbVar9);
              }
              for (lVar23 = 0;
                  bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                          ::count(pbVar7), lVar23 <= (int)((uint)bVar3 - iVar24);
                  lVar23 = lVar23 + 1) {
                sVar22 = sVar19 + lVar23;
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::max_count(pbVar7);
                if ((int)(uint)bVar3 < (int)sVar22) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                               );
                }
                pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                         ::child(pbVar7,sVar22);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::init_child(pbVar7,(int)lVar23,pbVar9);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::mutable_child(pbVar7,sVar22);
              }
            }
            fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8);
            ptVar14 = btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                                       *)pbVar8);
            ptVar14[2] = fVar1 + (char)sVar19;
            fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            ptVar14 = btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                                       *)pbVar7);
            ptVar14[2] = fVar1 - (char)sVar19;
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::max_count(iter->node);
            bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(iter->node);
            if ((uint)bVar3 - (uint)bVar4 == iVar24) {
              iVar24 = iter->position - iVar24;
              iter->position = iVar24;
              if (iVar24 < 0) {
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar8);
                iter->position = (uint)bVar3 + iVar24 + 1;
                iter->node = pbVar8;
              }
              else {
                pbVar8 = iter->node;
              }
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::max_count(iter->node);
              if (bVar3 < bVar4) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                           );
            }
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          __assert_fail("to_move <= right->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x883,
                        "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                       );
        }
      }
    }
    bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::position(iter->node);
    bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::count(pbVar7);
    if (bVar3 < bVar4) {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::position(iter->node);
      pbVar8 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
               ::child(pbVar7,(ulong)bVar3 + 1);
      fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::max_count(pbVar8);
      if (fVar1 != '\x1e') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb79,
                      "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::count(pbVar8);
      if (bVar3 < 0x1e) {
        bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::count(pbVar8);
        uVar18 = 0x1e - bVar3;
        iVar24 = iter->position;
        sVar6 = (short)((int)((uint)(ushort)((short)uVar18 >> 0xf) << 0x10 | uVar18 & 0xffff) /
                       (int)(short)((0 < iVar24) + 1));
        paVar16 = (allocator_type *)0x1;
        if (1 < sVar6) {
          paVar16 = (allocator_type *)(ulong)CONCAT22((short)(uVar18 >> 0x10),sVar6);
        }
        n = (pair<int,_int> **)((ulong)paVar16 & 0xffff);
        in_RCX = paVar16;
        bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::count(iter->node);
        uVar18 = (uint)n;
        if ((iVar24 <= (int)(bVar3 - uVar18)) ||
           (bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8), bVar3 + uVar18 < 0x1e)) {
          pbVar7 = iter->node;
          pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                   ::parent(pbVar7);
          pbVar10 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::parent(pbVar8);
          if (pbVar9 != pbVar10) {
            __assert_fail("parent() == right->parent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ab,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::position(pbVar7);
          bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::position(pbVar8);
          if (bVar3 + 1 != (uint)bVar4) {
            __assert_fail("position() + 1 == right->position()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ac,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar7);
          bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar8);
          if (bVar3 < bVar4) {
            __assert_fail("count() >= right->count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ad,
                          "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                  ::count(pbVar7);
          uVar17 = (ushort)paVar16;
          if (uVar17 <= bVar3) {
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8);
            if (bVar3 < uVar17) {
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              args = n;
              btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::uninitialized_move_n(pbVar8,(ulong)bVar3,0,(size_type)n,pbVar8,in_R9);
              pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                       ::parent(pbVar7);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::position(pbVar7);
              parent_iter.node =
                   (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    *)btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar9,(ulong)bVar3);
              btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
              ::value_init<std::pair<int,int>*>
                        ((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                          *)pbVar8,(ulong)(uVar18 - 1),(allocator_type *)&parent_iter,args);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              sVar19 = (size_type)(int)(~(uint)bVar3 + uVar18);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              psVar15 = (slot_type *)(ulong)bVar4;
              btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::uninitialized_move_n(pbVar7,sVar19,bVar3 - sVar19,(size_type)psVar15,pbVar8,in_R9);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::slot(pbVar7,(long)(int)((uint)bVar3 - (uVar18 - 1)));
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              sVar19 = bVar3 - sVar19;
            }
            else {
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::uninitialized_move_n
                        (pbVar8,(size_type)n,(long)(int)(bVar3 - uVar18),(ulong)bVar4,pbVar8,in_R9);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              if (uVar17 < bVar3) {
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar8);
                psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                          ::slot(pbVar8,(long)(int)(~uVar18 + (uint)bVar3));
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar8);
                psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                          ::slot(pbVar8,(ulong)bVar3 - 1);
                psVar13 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                          ::slot(pbVar8,0);
                for (; psVar13 <= psVar11; psVar11 = psVar11 + -1) {
                  psVar12->first = psVar11->first;
                  psVar12->second = psVar11->second;
                  psVar12 = psVar12 + -1;
                }
              }
              pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                       ::parent(pbVar7);
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::position(pbVar7);
              psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::slot(pbVar9,(ulong)bVar3);
              psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::slot(pbVar8,(ulong)(uVar18 - 1));
              psVar12->first = psVar11->first;
              psVar15 = (slot_type *)(ulong)(uint)psVar11->second;
              psVar12->second = psVar11->second;
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::slot(pbVar7,(long)(int)((uint)bVar3 - (uVar18 - 1)));
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              sVar19 = (size_type)bVar3;
            }
            psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,sVar19);
            psVar13 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar8,0);
            set_slot_policy<std::pair<int,int>>::
            move<phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>
                      ((PropagatingCountingAlloc<std::pair<int,_int>_> *)psVar11,psVar12,psVar13,
                       psVar15);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            psVar11 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar7,(long)(int)(bVar3 - uVar18));
            pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                     ::parent(pbVar7);
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::position(pbVar7);
            psVar12 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::slot(pbVar9,(ulong)bVar3);
            psVar12->first = psVar11->first;
            paVar16 = (allocator_type *)(ulong)(uint)psVar11->second;
            psVar12->second = psVar11->second;
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::value_destroy_n(pbVar7,(long)(int)(bVar3 - uVar18),(size_type)n,paVar16);
            bVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::leaf(pbVar7);
            if (!bVar5) {
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar8);
              for (uVar21 = (uint)bVar3; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
                pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                         ::child(pbVar8,(ulong)uVar21);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::init_child(pbVar8,uVar18 + uVar21,pbVar9);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::mutable_child(pbVar8,(ulong)uVar21);
              }
              iVar24 = 1;
              iVar20 = -uVar18;
              while (iVar20 = iVar20 + 1, iVar20 != 1) {
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar7);
                pbVar9 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                         ::child(pbVar7,(long)(int)((uint)bVar3 + iVar20));
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::init_child(pbVar8,iVar24 + -1,pbVar9);
                bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                        ::count(pbVar7);
                btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                ::mutable_child(pbVar7,(long)(int)((uint)bVar3 + iVar20));
                iVar24 = iVar24 + 1;
              }
            }
            fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            ptVar14 = btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                                       *)pbVar7);
            ptVar14[2] = fVar1 - (char)n;
            fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar8);
            ptVar14 = btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>,256,false>>
                                       *)pbVar8);
            ptVar14[2] = fVar1 + (char)n;
            iVar24 = iter->position;
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(iter->node);
            pbVar7 = iter->node;
            if ((int)(uint)bVar3 < iVar24) {
              iVar24 = iter->position;
              bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                      ::count(pbVar7);
              iter->position = ~(uint)bVar3 + iVar24;
              iter->node = pbVar8;
              pbVar7 = pbVar8;
            }
            bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::count(pbVar7);
            bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
                    ::max_count(iter->node);
            if (bVar3 < bVar4) {
              return;
            }
            __assert_fail("node->count() < node->max_count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb8b,
                          "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                         );
          }
          __assert_fail("to_move <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x8af,
                        "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                       );
        }
      }
    }
    fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::max_count(pbVar7);
    if (fVar1 != '\x1e') {
      __assert_fail("parent->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb93,
                    "void phmap::priv::btree<phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<int, int>>, 256, false>]"
                   );
    }
    fVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::count(pbVar7);
    if (fVar1 == '\x1e') {
      pbVar8 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
               ::parent(iter->node);
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              ::position(iter->node);
      parent_iter.position = (int)bVar3;
      parent_iter.node = pbVar8;
      rebalance_or_split(this,&parent_iter);
    }
  }
  bVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::leaf(iter->node);
  if (bVar5) {
    sVar19 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
             ::LeafSize(0x1e);
    pbVar8 = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
              *)Allocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,int>>>
                          (&(this->root_).
                            super__Tuple_impl<0UL,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>_*>
                            .
                            super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_false>
                            ._M_head_impl,sVar19);
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
    ::init_leaf(pbVar8,pbVar7,0x1e);
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
    ::split(iter->node,iter->position,pbVar8,in_RCX);
    if (this->rightmost_ == iter->node) {
      this->rightmost_ = pbVar8;
    }
  }
  else {
    pbVar8 = new_internal_node(this,pbVar7);
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
    ::split(iter->node,iter->position,pbVar8,in_RCX);
  }
  iVar24 = iter->position;
  bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
          ::count(iter->node);
  if ((int)(uint)bVar3 < iVar24) {
    iVar24 = iter->position;
    bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
            ::count(iter->node);
    iter->position = ~(uint)bVar3 + iVar24;
    iter->node = pbVar8;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }